

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::setCentralWidget(QMainWindowLayout *this,QWidget *widget)

{
  bool bVar1;
  long in_RSI;
  QWidget *in_RDI;
  QMainWindowLayoutState *unaff_retaddr;
  QWidget *in_stack_00000018;
  QLayout *in_stack_00000020;
  QWidget *widget_00;
  
  widget_00 = in_RDI;
  if (in_RSI != 0) {
    QLayout::addChildWidget(in_stack_00000020,in_stack_00000018);
  }
  QMainWindowLayoutState::setCentralWidget(unaff_retaddr,widget_00);
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5fbcb6);
  if (bVar1) {
    in_RDI[0x1f].data = *(QWidgetData **)&in_RDI[0xb].field_0x8;
    *(undefined1 *)((long)&in_RDI[0x2b].data + 4) = 1;
  }
  (**(code **)(*(long *)in_RDI + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::setCentralWidget(QWidget *widget)
{
    if (widget != nullptr)
        addChildWidget(widget);
    layoutState.setCentralWidget(widget);
    if (savedState.isValid()) {
#if QT_CONFIG(dockwidget)
        savedState.dockAreaLayout.centralWidgetItem = layoutState.dockAreaLayout.centralWidgetItem;
        savedState.dockAreaLayout.fallbackToSizeHints = true;
#else
        savedState.centralWidgetItem = layoutState.centralWidgetItem;
#endif
    }
    invalidate();
}